

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UniValue * __thiscall
DescribeAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeAddressVisitor *this,PayToAnchor *anchor)

{
  string str;
  string key;
  string key_00;
  long in_FS_OFFSET;
  undefined1 in_stack_fffffffffffffec8 [14];
  bool in_stack_fffffffffffffed6;
  bool bVar1;
  undefined1 in_stack_fffffffffffffed7 [17];
  UniValue in_stack_fffffffffffffee8;
  UniValue local_b0;
  string local_58 [32];
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  str._M_string_length._6_1_ = in_stack_fffffffffffffed6;
  str._0_14_ = in_stack_fffffffffffffec8;
  str._15_17_ = in_stack_fffffffffffffed7;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"isscript",(allocator<char> *)&stack0xfffffffffffffed7);
  bVar1 = true;
  UniValue::UniValue<bool,_bool,_true>(&local_b0,(bool *)&stack0xfffffffffffffed6);
  key._M_string_length._6_1_ = bVar1;
  key._0_14_ = in_stack_fffffffffffffec8;
  key._15_17_ = in_stack_fffffffffffffed7;
  UniValue::pushKV(__return_storage_ptr__,key,in_stack_fffffffffffffee8);
  UniValue::~UniValue(&local_b0);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff30,"iswitness",
             (allocator<char> *)&stack0xfffffffffffffed7);
  bVar1 = true;
  UniValue::UniValue<bool,_bool,_true>
            ((UniValue *)&stack0xfffffffffffffed8,(bool *)&stack0xfffffffffffffed6);
  key_00._M_string_length._6_1_ = bVar1;
  key_00._0_14_ = in_stack_fffffffffffffec8;
  key_00._15_17_ = in_stack_fffffffffffffed7;
  UniValue::pushKV(__return_storage_ptr__,key_00,in_stack_fffffffffffffee8);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffed8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const PayToAnchor& anchor) const
    {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("isscript", true);
        obj.pushKV("iswitness", true);
        return obj;
    }